

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSeparation.cpp
# Opt level: O3

void __thiscall HighsSeparation::separate(HighsSeparation *this,HighsDomain *propdomain)

{
  HighsMipSolver *pHVar1;
  HighsInt HVar2;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var3;
  long lVar4;
  HighsLpRelaxation *this_00;
  double dVar5;
  double dVar6;
  Status status;
  Status local_3c;
  double local_38;
  double local_30;
  
  this_00 = this->lp;
  local_3c = this_00->status;
  pHVar1 = this_00->mipsolver;
  if (((kUnscaledInfeasible < local_3c) || ((0x3aU >> (local_3c & 0x1f) & 1) == 0)) ||
     ((this_00->fractionalints).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this_00->fractionalints).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    HighsLpRelaxation::performAging(this_00,true);
    HighsCutPool::performAging
              (&((pHVar1->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cutpool);
    return;
  }
  _Var3._M_head_impl =
       (pHVar1->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  local_38 = (_Var3._M_head_impl)->rootlpsolobj;
  dVar6 = this_00->objective;
  do {
    if ((_Var3._M_head_impl)->optimality_limit <= dVar6) {
      return;
    }
    lVar4 = this_00->numlpiters;
    local_30 = dVar6;
    HVar2 = separationRound(this,propdomain,&local_3c);
    this_00 = this->lp;
    lVar4 = this_00->numlpiters - lVar4;
    _Var3._M_head_impl =
         (pHVar1->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    (_Var3._M_head_impl)->sepa_lp_iterations = (_Var3._M_head_impl)->sepa_lp_iterations + lVar4;
    (_Var3._M_head_impl)->total_lp_iterations = (_Var3._M_head_impl)->total_lp_iterations + lVar4;
    if (HVar2 == 0) {
      return;
    }
    if ((2 < local_3c - kUnscaledDualFeasible) && (local_3c != kOptimal)) {
      return;
    }
    if ((this_00->fractionalints).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start ==
        (this_00->fractionalints).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      return;
    }
    dVar6 = this_00->objective;
    dVar5 = (_Var3._M_head_impl)->feastol;
    if ((_Var3._M_head_impl)->feastol <= local_30 - local_38) {
      dVar5 = local_30 - local_38;
    }
  } while (dVar5 * 1.01 < dVar6 - local_38);
  return;
}

Assistant:

void HighsSeparation::separate(HighsDomain& propdomain) {
  HighsLpRelaxation::Status status = lp->getStatus();
  const HighsMipSolver& mipsolver = lp->getMipSolver();

  if (lp->scaledOptimal(status) && !lp->getFractionalIntegers().empty()) {
    // double firstobj = lp->getObjective();
    double firstobj = mipsolver.mipdata_->rootlpsolobj;

    while (lp->getObjective() < mipsolver.mipdata_->optimality_limit) {
      double lastobj = lp->getObjective();

      size_t nlpiters = -lp->getNumLpIterations();
      HighsInt ncuts = separationRound(propdomain, status);
      nlpiters += lp->getNumLpIterations();
      mipsolver.mipdata_->sepa_lp_iterations += nlpiters;
      mipsolver.mipdata_->total_lp_iterations += nlpiters;
      // printf("separated %" HIGHSINT_FORMAT " cuts\n", ncuts);

      // printf(
      //     "separation round %" HIGHSINT_FORMAT " at node %" HIGHSINT_FORMAT "
      //     added %" HIGHSINT_FORMAT " cuts objective changed " "from %g to %g,
      //     first obj is %g\n", nrounds, (HighsInt)nnodes, ncuts, lastobj,
      //     lp->getObjective(), firstobj);
      if (ncuts == 0 || !lp->scaledOptimal(status) ||
          lp->getFractionalIntegers().empty())
        break;

      // if the objective improved considerably we continue
      if ((lp->getObjective() - firstobj) <=
          std::max((lastobj - firstobj), mipsolver.mipdata_->feastol) * 1.01)
        break;
    }

    // printf("done separating\n");
  } else {
    // printf("no separation, just aging. status: %" HIGHSINT_FORMAT "\n",
    //        (HighsInt)status);
    lp->performAging(true);
    mipsolver.mipdata_->cutpool.performAging();
  }
}